

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

void __thiscall QCalendarWidget::updateCell(QCalendarWidget *this,QDate date)

{
  long lVar1;
  QRect QVar2;
  QRect QVar3;
  QRect QVar4;
  QWidget *this_00;
  long in_FS_OFFSET;
  int column;
  int row;
  QRect local_68;
  undefined8 uStack_58;
  int local_50;
  int local_4c;
  int local_48;
  int iStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  char *local_30;
  long local_20;
  
  QVar2._8_8_ = local_68._8_8_;
  QVar2._0_8_ = local_68._0_8_;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (date.jd + 0xb69eeff91fU < 0x16d3e147974) {
    if ((((this->super_QWidget).data)->widget_attributes & 0x8000) != 0) {
      lVar1 = *(long *)&(this->super_QWidget).field_0x8;
      local_4c = -0x55555556;
      local_50 = -0x55555556;
      QtPrivate::QCalendarModel::cellForDate
                (*(QCalendarModel **)(lVar1 + 600),date,&local_4c,&local_50);
      QVar2.x2.m_i = local_68.x2.m_i;
      QVar2.y2.m_i = local_68.y2.m_i;
      QVar2.x1.m_i = local_68.x1.m_i;
      QVar2.y1.m_i = local_68.y1.m_i;
      if (local_50 != -1 && local_4c != -1) {
        local_38 = 0xaaaaaaaa;
        uStack_34 = 0xaaaaaaaa;
        local_48 = -0x55555556;
        iStack_44 = -0x55555556;
        uStack_40 = 0xaaaaaaaa;
        uStack_3c = 0xaaaaaaaa;
        local_68.x1.m_i = -1;
        local_68.y1.m_i = -1;
        local_68.x2.m_i = 0;
        local_68.y2.m_i = 0;
        uStack_58 = 0;
        (**(code **)(**(long **)(lVar1 + 600) + 0x60))(&local_48);
        QVar4.x2.m_i = local_68.x2.m_i;
        QVar4.y2.m_i = local_68.y2.m_i;
        QVar4.x1.m_i = local_68.x1.m_i;
        QVar4.y1.m_i = local_68.y1.m_i;
        QVar3.x2.m_i = local_68.x2.m_i;
        QVar3.y2.m_i = local_68.y2.m_i;
        QVar3.x1.m_i = local_68.x1.m_i;
        QVar3.y1.m_i = local_68.y1.m_i;
        QVar2.x2.m_i = local_68.x2.m_i;
        QVar2.y2.m_i = local_68.y2.m_i;
        QVar2.x1.m_i = local_68.x1.m_i;
        QVar2.y1.m_i = local_68.y1.m_i;
        if (((-1 < local_48) && (QVar2 = QVar3, -1 < iStack_44)) &&
           (QVar2 = QVar4, CONCAT44(uStack_34,local_38) != 0)) {
          this_00 = QAbstractScrollArea::viewport(*(QAbstractScrollArea **)(lVar1 + 0x260));
          local_68 = (QRect)(**(code **)(**(long **)(lVar1 + 0x260) + 0x1e0))
                                      (*(long **)(lVar1 + 0x260),&local_48);
          QWidget::update(this_00,&local_68);
          QVar2 = local_68;
        }
      }
    }
  }
  else {
    local_48 = 2;
    uStack_34 = 0;
    iStack_44 = 0;
    uStack_40 = 0;
    uStack_3c = 0;
    local_38 = 0;
    local_30 = "default";
    QMessageLogger::warning((char *)&local_48,"QCalendarWidget::updateCell: Invalid date");
    QVar2.x2.m_i = local_68.x2.m_i;
    QVar2.y2.m_i = local_68.y2.m_i;
    QVar2.x1.m_i = local_68.x1.m_i;
    QVar2.y1.m_i = local_68.y1.m_i;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  local_68 = QVar2;
  __stack_chk_fail();
}

Assistant:

void QCalendarWidget::updateCell(QDate date)
{
    if (Q_UNLIKELY(!date.isValid())) {
        qWarning("QCalendarWidget::updateCell: Invalid date");
        return;
    }

    if (!isVisible())
        return;

    Q_D(QCalendarWidget);
    int row, column;
    d->m_model->cellForDate(date, &row, &column);
    if (row == -1 || column == -1)
        return;

    QModelIndex modelIndex = d->m_model->index(row, column);
    if (!modelIndex.isValid())
        return;

    d->m_view->viewport()->update(d->m_view->visualRect(modelIndex));
}